

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipeDensity.cpp
# Opt level: O0

void __thiscall OpenMD::PipeDensity::writeDensity(PipeDensity *this)

{
  byte bVar1;
  char *pcVar2;
  ostream *poVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  undefined8 uVar7;
  long in_RDI;
  uint j;
  uint i;
  ofstream rdfStream;
  uint local_21c;
  uint local_218;
  ostream local_208 [520];
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_208,pcVar2,_S_out);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    uVar7 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"PipeDensity: unable to open %s\n",uVar7);
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::operator<<(local_208,"#PipeDensity\n");
    poVar3 = std::operator<<(local_208,"#nFrames:\t");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0xd0));
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(local_208,"#selection: (");
    poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 0xd8));
    std::operator<<(poVar3,")\n");
    poVar3 = std::operator<<(local_208,"#density (");
    poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 0x718));
    poVar3 = std::operator<<(poVar3,",");
    poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 0x738));
    std::operator<<(poVar3,")\n");
    for (local_218 = 0;
        sVar4 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        *)(in_RDI + 0x778)), local_218 < sVar4; local_218 = local_218 + 1) {
      local_21c = 0;
      while( true ) {
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x778),(ulong)local_218);
        sVar4 = std::vector<double,_std::allocator<double>_>::size(pvVar5);
        if (sVar4 <= local_21c) break;
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x778),(ulong)local_218);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(ulong)local_21c);
        std::ostream::operator<<(local_208,(*pvVar6 * 1.66053886) / (double)*(int *)(in_RDI + 0xd0))
        ;
        std::operator<<(local_208,"\t");
        local_21c = local_21c + 1;
      }
      std::operator<<(local_208,"\n");
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_208);
  return;
}

Assistant:

void PipeDensity::writeDensity() {
    std::ofstream rdfStream(outputFilename_.c_str());

    if (rdfStream.is_open()) {
      rdfStream << "#PipeDensity\n";
      rdfStream << "#nFrames:\t" << nProcessed_ << "\n";
      rdfStream << "#selection: (" << selectionScript_ << ")\n";
      rdfStream << "#density (" << axisLabel1_ << "," << axisLabel2_ << ")\n";
      for (unsigned int i = 0; i < density_.size(); ++i) {
        for (unsigned int j = 0; j < density_[i].size(); ++j) {
          rdfStream << Constants::densityConvert * density_[i][j] / nProcessed_;
          rdfStream << "\t";
        }
        rdfStream << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "PipeDensity: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    rdfStream.close();
  }